

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# c_cvars.cpp
# Opt level: O0

void Cmd_archivecvar(FCommandLine *argv,APlayerPawn *who,int key)

{
  int iVar1;
  uint32 uVar2;
  char *var_name;
  FBaseCVar *this;
  FBaseCVar *var;
  int key_local;
  APlayerPawn *who_local;
  FCommandLine *argv_local;
  
  iVar1 = FCommandLine::argc(argv);
  if (iVar1 == 1) {
    Printf("Usage: archivecvar <cvar>\n");
  }
  else {
    var_name = FCommandLine::operator[](argv,1);
    this = FindCVar(var_name,(FBaseCVar **)0x0);
    if ((this != (FBaseCVar *)0x0) && (uVar2 = FBaseCVar::GetFlags(this), (uVar2 & 0x100) != 0)) {
      FBaseCVar::SetArchiveBit(this);
    }
  }
  return;
}

Assistant:

CCMD (archivecvar)
{

	if (argv.argc() == 1)
	{
		Printf ("Usage: archivecvar <cvar>\n");
	}
	else
	{
		FBaseCVar *var = FindCVar (argv[1], NULL);

		if (var != NULL && (var->GetFlags() & CVAR_AUTO))
		{
			var->SetArchiveBit ();
		}
	}
}